

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O1

void __thiscall
duckdb::PiecewiseMergeJoinState::PiecewiseMergeJoinState
          (PiecewiseMergeJoinState *this,ClientContext *context,PhysicalPiecewiseMergeJoin *op,
          bool force_external)

{
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *this_00;
  pointer pBVar1;
  pointer pLVar2;
  pointer pLVar3;
  bool enabled_p;
  Allocator *pAVar4;
  BufferManager *pBVar5;
  pointer pEVar6;
  const_reference pvVar7;
  const_reference this_01;
  type expr;
  pointer *__ptr;
  BoundOrderByNode *order;
  pointer pBVar8;
  pointer *__ptr_2;
  LogicalType *this_02;
  pointer *__ptr_1;
  vector<duckdb::LogicalType,_true> condition_types;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_a8;
  DataChunk *local_88;
  vector<duckdb::BoundOrderByNode,_true> *local_80;
  RowLayout *local_78;
  DataChunk *local_70;
  BoundOrderByNode local_68;
  OuterJoinMarker *local_50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  (this->super_CachingOperatorState).initialized = false;
  (this->super_CachingOperatorState).can_cache_chunk = false;
  (this->super_CachingOperatorState).cached_chunk.
  super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
  super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl = (DataChunk *)0x0;
  (this->super_CachingOperatorState).super_OperatorState._vptr_OperatorState =
       (_func_int **)&PTR__PiecewiseMergeJoinState_0249ef78;
  this->context = context;
  pAVar4 = Allocator::Get(context);
  this->allocator = pAVar4;
  this->op = op;
  pBVar5 = BufferManager::GetBufferManager(context);
  this->buffer_manager = pBVar5;
  this->force_external = force_external;
  local_70 = &this->lhs_payload;
  DataChunk::DataChunk(local_70);
  enabled_p = IsLeftOuterJoin((op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                              super_PhysicalJoin.super_CachingPhysicalOperator.field_0x81);
  OuterJoinMarker::OuterJoinMarker(&this->left_outer,enabled_p);
  local_80 = &this->lhs_order;
  (this->lhs_order).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lhs_order).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lhs_order).
  super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = &this->lhs_layout;
  RowLayout::RowLayout(local_78);
  (this->scanner).
  super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
  super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>.
  super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl = (PayloadScanner *)0x0;
  this->left_position = 0;
  (this->lhs_local_table).
  super_unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PhysicalRangeJoin::LocalSortedTable_*,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
  .super__Head_base<0UL,_duckdb::PhysicalRangeJoin::LocalSortedTable_*,_false>._M_head_impl =
       (LocalSortedTable *)0x0;
  (this->lhs_global_state).
  super_unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>.
  super__Head_base<0UL,_duckdb::GlobalSortState_*,_false>._M_head_impl = (GlobalSortState *)0x0;
  this->first_fetch = true;
  this->finished = true;
  (this->sel).sel_vector = (sel_t *)0x0;
  (this->sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88 = &this->rhs_keys;
  this->right_position = 0;
  this->right_chunk_index = 0;
  DataChunk::DataChunk(local_88);
  DataChunk::DataChunk(&this->rhs_input);
  local_50 = &this->left_outer;
  ExpressionExecutor::ExpressionExecutor(&this->rhs_executor,context);
  (this->payload_heap_handles).
  super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->payload_heap_handles).
  super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->payload_heap_handles).
  super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (LogicalType *)0x0;
  local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (LogicalType *)0x0;
  pBVar8 = (op->lhs_orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar1 = (op->lhs_orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pBVar8 != pBVar1) {
    do {
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&pBVar8->expression);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&local_a8,&pEVar6->return_type);
      pBVar8 = pBVar8 + 1;
    } while (pBVar8 != pBVar1);
  }
  OuterJoinMarker::Initialize(local_50,0x800);
  this_00 = &(op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.super_PhysicalJoin.
             super_CachingPhysicalOperator.super_PhysicalOperator.children;
  pvVar7 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_00,0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,
             &(pvVar7->_M_data->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  RowLayout::Initialize(local_78,(vector<duckdb::LogicalType,_true> *)&local_48,true);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  pAVar4 = this->allocator;
  pvVar7 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_00,0);
  DataChunk::Initialize(local_70,pAVar4,&pvVar7->_M_data->types,0x800);
  this_01 = vector<duckdb::BoundOrderByNode,_true>::operator[](&op->lhs_orders,0);
  BoundOrderByNode::Copy(&local_68,this_01);
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
  emplace_back<duckdb::BoundOrderByNode>
            (&local_80->
              super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>,
             &local_68);
  if (local_68.stats.
      super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
      super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
       )0x0) {
    BaseStatistics::~BaseStatistics
              ((BaseStatistics *)
               local_68.stats.
               super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
               .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl);
    operator_delete((void *)local_68.stats.
                            super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                            .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl);
  }
  local_68.stats.
  super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
  super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>.
  super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
       (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
        )0x0;
  if (local_68.expression.
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)0x0)
  {
    (**(code **)(*(long *)local_68.expression.
                          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                          .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))();
  }
  SelectionVector::Initialize(&this->sel,0x800);
  pLVar3 = local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pLVar2 = local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  this_02 = local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start) {
    do {
      LogicalType::~LogicalType(this_02);
      this_02 = this_02 + 1;
    } while (this_02 != pLVar3);
    local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar2;
  }
  pBVar8 = (op->rhs_orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar1 = (op->rhs_orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pBVar8 != pBVar1) {
    do {
      expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&pBVar8->expression);
      ExpressionExecutor::AddExpression(&this->rhs_executor,expr);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&pBVar8->expression);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&local_a8,&pEVar6->return_type);
      pBVar8 = pBVar8 + 1;
    } while (pBVar8 != pBVar1);
  }
  DataChunk::Initialize
            (local_88,this->allocator,(vector<duckdb::LogicalType,_true> *)&local_a8,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_a8);
  return;
}

Assistant:

PiecewiseMergeJoinState(ClientContext &context, const PhysicalPiecewiseMergeJoin &op, bool force_external)
	    : context(context), allocator(Allocator::Get(context)), op(op),
	      buffer_manager(BufferManager::GetBufferManager(context)), force_external(force_external),
	      left_outer(IsLeftOuterJoin(op.join_type)), left_position(0), first_fetch(true), finished(true),
	      right_position(0), right_chunk_index(0), rhs_executor(context) {
		vector<LogicalType> condition_types;
		for (auto &order : op.lhs_orders) {
			condition_types.push_back(order.expression->return_type);
		}
		left_outer.Initialize(STANDARD_VECTOR_SIZE);
		lhs_layout.Initialize(op.children[0].get().GetTypes());
		lhs_payload.Initialize(allocator, op.children[0].get().GetTypes());

		lhs_order.emplace_back(op.lhs_orders[0].Copy());

		// Set up shared data for multiple predicates
		sel.Initialize(STANDARD_VECTOR_SIZE);
		condition_types.clear();
		for (auto &order : op.rhs_orders) {
			rhs_executor.AddExpression(*order.expression);
			condition_types.push_back(order.expression->return_type);
		}
		rhs_keys.Initialize(allocator, condition_types);
	}